

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_v_predictor_32x16_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int local_28c;
  uint16_t *local_220;
  int i;
  __m128i above3_u16;
  __m128i above2_u16;
  __m128i above1_u16;
  __m128i above0_u16;
  int bd_local;
  uint16_t *left_local;
  uint16_t *above_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  uVar1 = *(undefined8 *)above;
  uVar2 = *(undefined8 *)(above + 4);
  uVar3 = *(undefined8 *)(above + 8);
  uVar4 = *(undefined8 *)(above + 0xc);
  uVar5 = *(undefined8 *)(above + 0x10);
  uVar6 = *(undefined8 *)(above + 0x14);
  uVar7 = *(undefined8 *)(above + 0x18);
  uVar8 = *(undefined8 *)(above + 0x1c);
  local_220 = dst;
  for (local_28c = 0; local_28c < 4; local_28c = local_28c + 1) {
    *(undefined8 *)local_220 = uVar1;
    *(undefined8 *)(local_220 + 4) = uVar2;
    *(undefined8 *)(local_220 + 8) = uVar3;
    *(undefined8 *)(local_220 + 0xc) = uVar4;
    *(undefined8 *)(local_220 + 0x10) = uVar5;
    *(undefined8 *)(local_220 + 0x14) = uVar6;
    *(undefined8 *)(local_220 + 0x18) = uVar7;
    *(undefined8 *)(local_220 + 0x1c) = uVar8;
    local_220 = local_220 + stride;
    *(undefined8 *)local_220 = uVar1;
    *(undefined8 *)(local_220 + 4) = uVar2;
    *(undefined8 *)(local_220 + 8) = uVar3;
    *(undefined8 *)(local_220 + 0xc) = uVar4;
    *(undefined8 *)(local_220 + 0x10) = uVar5;
    *(undefined8 *)(local_220 + 0x14) = uVar6;
    *(undefined8 *)(local_220 + 0x18) = uVar7;
    *(undefined8 *)(local_220 + 0x1c) = uVar8;
    local_220 = local_220 + stride;
    *(undefined8 *)local_220 = uVar1;
    *(undefined8 *)(local_220 + 4) = uVar2;
    *(undefined8 *)(local_220 + 8) = uVar3;
    *(undefined8 *)(local_220 + 0xc) = uVar4;
    *(undefined8 *)(local_220 + 0x10) = uVar5;
    *(undefined8 *)(local_220 + 0x14) = uVar6;
    *(undefined8 *)(local_220 + 0x18) = uVar7;
    *(undefined8 *)(local_220 + 0x1c) = uVar8;
    local_220 = local_220 + stride;
    *(undefined8 *)local_220 = uVar1;
    *(undefined8 *)(local_220 + 4) = uVar2;
    *(undefined8 *)(local_220 + 8) = uVar3;
    *(undefined8 *)(local_220 + 0xc) = uVar4;
    *(undefined8 *)(local_220 + 0x10) = uVar5;
    *(undefined8 *)(local_220 + 0x14) = uVar6;
    *(undefined8 *)(local_220 + 0x18) = uVar7;
    *(undefined8 *)(local_220 + 0x1c) = uVar8;
    local_220 = local_220 + stride;
  }
  return;
}

Assistant:

void aom_highbd_v_predictor_32x16_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  (void)left;
  (void)bd;
  const __m128i above0_u16 = _mm_load_si128((const __m128i *)above);
  const __m128i above1_u16 = _mm_load_si128((const __m128i *)(above + 8));
  const __m128i above2_u16 = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i above3_u16 = _mm_load_si128((const __m128i *)(above + 24));
  int i;
  for (i = 0; i < 4; ++i) {
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    _mm_store_si128((__m128i *)(dst + 16), above2_u16);
    _mm_store_si128((__m128i *)(dst + 24), above3_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    _mm_store_si128((__m128i *)(dst + 16), above2_u16);
    _mm_store_si128((__m128i *)(dst + 24), above3_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    _mm_store_si128((__m128i *)(dst + 16), above2_u16);
    _mm_store_si128((__m128i *)(dst + 24), above3_u16);
    dst += stride;
    _mm_store_si128((__m128i *)dst, above0_u16);
    _mm_store_si128((__m128i *)(dst + 8), above1_u16);
    _mm_store_si128((__m128i *)(dst + 16), above2_u16);
    _mm_store_si128((__m128i *)(dst + 24), above3_u16);
    dst += stride;
  }
}